

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Player.cpp
# Opt level: O0

vector<Card_*,_std::allocator<Card_*>_> * __thiscall
Player::getAvailableCards
          (vector<Card_*,_std::allocator<Card_*>_> *__return_storage_ptr__,Player *this,Type color)

{
  bool bVar1;
  iterator __first;
  iterator __last;
  back_insert_iterator<std::vector<Card_*,_std::allocator<Card_*>_>_> __result;
  undefined1 local_38 [8];
  vector<Card_*,_std::allocator<Card_*>_> available_cards;
  Type color_local;
  Player *this_local;
  
  available_cards.super__Vector_base<Card_*,_std::allocator<Card_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = color;
  std::vector<Card_*,_std::allocator<Card_*>_>::vector
            ((vector<Card_*,_std::allocator<Card_*>_> *)local_38);
  __first = std::vector<Card_*,_std::allocator<Card_*>_>::begin(&this->_hand);
  __last = std::vector<Card_*,_std::allocator<Card_*>_>::end(&this->_hand);
  __result = std::back_inserter<std::vector<Card*,std::allocator<Card*>>>
                       ((vector<Card_*,_std::allocator<Card_*>_> *)local_38);
  std::
  copy_if<__gnu_cxx::__normal_iterator<Card**,std::vector<Card*,std::allocator<Card*>>>,std::back_insert_iterator<std::vector<Card*,std::allocator<Card*>>>,Player::getAvailableCards(Color::Type)::__0>
            ((__normal_iterator<Card_**,_std::vector<Card_*,_std::allocator<Card_*>_>_>)
             __first._M_current,
             (__normal_iterator<Card_**,_std::vector<Card_*,_std::allocator<Card_*>_>_>)
             __last._M_current,__result,
             available_cards.super__Vector_base<Card_*,_std::allocator<Card_*>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage._4_4_);
  bVar1 = std::vector<Card_*,_std::allocator<Card_*>_>::empty
                    ((vector<Card_*,_std::allocator<Card_*>_> *)local_38);
  if (bVar1) {
    std::vector<Card_*,_std::allocator<Card_*>_>::vector(__return_storage_ptr__,&this->_hand);
  }
  else {
    std::vector<Card_*,_std::allocator<Card_*>_>::vector
              (__return_storage_ptr__,(vector<Card_*,_std::allocator<Card_*>_> *)local_38);
  }
  std::vector<Card_*,_std::allocator<Card_*>_>::~vector
            ((vector<Card_*,_std::allocator<Card_*>_> *)local_38);
  return __return_storage_ptr__;
}

Assistant:

std::vector<Card *> Player::getAvailableCards(Color::Type color) {
    std::vector<Card *> available_cards;
    copy_if(_hand.begin(), _hand.end(), std::back_inserter(available_cards),
            [color](const Card *card) {
                return card->getColor() == color;
            });
    if (available_cards.empty()) return _hand;
    return available_cards;
}